

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O0

void __thiscall
spdlog::details::async_log_helper::handle_flush_interval
          (async_log_helper *this,time_point *now,time_point *last_flush)

{
  bool bVar1;
  __shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  time_point tVar3;
  bool local_71;
  bool local_61;
  shared_ptr<spdlog::sinks::sink> *s;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *__range2;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  bool local_21;
  time_point *ptStack_20;
  bool should_flush;
  time_point *last_flush_local;
  time_point *now_local;
  async_log_helper *this_local;
  
  local_61 = true;
  ptStack_20 = last_flush;
  last_flush_local = now;
  now_local = (time_point *)this;
  if ((this->_flush_requested & 1U) == 0) {
    local_30 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::zero();
    bVar1 = std::chrono::operator!=(&this->_flush_interval_ms,&local_30);
    local_71 = false;
    if (bVar1) {
      __range2 = (vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
                  *)std::chrono::operator-(last_flush_local,ptStack_20);
      local_71 = std::chrono::operator>=
                           ((duration<long,_std::ratio<1L,_1000000000L>_> *)&__range2,
                            &this->_flush_interval_ms);
    }
    local_61 = local_71;
  }
  local_21 = local_61;
  if (local_61 != false) {
    __end2 = std::
             vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
             ::begin(&this->_sinks);
    s = (shared_ptr<spdlog::sinks::sink> *)
        std::
        vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
        ::end(&this->_sinks);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                                       *)&s), bVar1) {
      this_00 = (__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                   ::operator*(&__end2);
      peVar2 = std::
               __shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      (*peVar2->_vptr_sink[3])();
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
      ::operator++(&__end2);
    }
    tVar3 = os::now();
    (ptStack_20->__d).__r = (rep)tVar3.__d.__r;
    (last_flush_local->__d).__r = (ptStack_20->__d).__r;
    this->_flush_requested = false;
  }
  return;
}

Assistant:

inline void spdlog::details::async_log_helper::handle_flush_interval(log_clock::time_point &now, log_clock::time_point &last_flush)
{
    auto should_flush =
        _flush_requested || (_flush_interval_ms != std::chrono::milliseconds::zero() && now - last_flush >= _flush_interval_ms);
    if (should_flush)
    {
        for (auto &s : _sinks)
        {
            s->flush();
        }
        now = last_flush = details::os::now();
        _flush_requested = false;
    }
}